

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ParseContext::ParseGroup
          (ParseContext *this,MessageLite *msg,char *ptr,uint32_t tag)

{
  long v1;
  uint32_t uVar1;
  char *pcVar2;
  char *pcVar3;
  Nonnull<const_char_*> pcVar4;
  int iVar5;
  long v1_00;
  int iVar6;
  
  iVar5 = this->depth_;
  v1 = (long)iVar5 + -1;
  iVar6 = (int)v1;
  this->depth_ = iVar6;
  if ((long)iVar5 < 1) {
    pcVar3 = (char *)0x0;
  }
  else {
    v1_00 = (long)this->group_depth_ + 1;
    iVar5 = (int)v1_00;
    this->group_depth_ = iVar5;
    pcVar2 = MessageLite::_InternalParse(msg,ptr,this);
    if (pcVar2 != (char *)0x0) {
      if (iVar6 == this->depth_) {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1,(long)this->depth_,"old_depth == depth_");
      }
      if (pcVar4 != (Nonnull<const_char_*>)0x0) {
        ParseGroup();
LAB_002911f5:
        ParseGroup();
      }
      if (iVar5 == this->group_depth_) {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1_00,(long)this->group_depth_,"old_group_depth == group_depth_");
      }
      if (pcVar4 != (Nonnull<const_char_*>)0x0) goto LAB_002911f5;
    }
    this->group_depth_ = this->group_depth_ + -1;
    this->depth_ = this->depth_ + 1;
    uVar1 = (this->super_EpsCopyInputStream).last_tag_minus_1_;
    (this->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar3 = (char *)0x0;
    if (uVar1 == tag) {
      pcVar3 = pcVar2;
    }
  }
  return pcVar3;
}

Assistant:

[[nodiscard]] PROTOBUF_NDEBUG_INLINE const char* ParseGroup(MessageLite* msg,
                                                              const char* ptr,
                                                              uint32_t tag) {
    if (--depth_ < 0) return nullptr;
    group_depth_++;
    auto old_depth = depth_;
    auto old_group_depth = group_depth_;
    ptr = msg->_InternalParse(ptr, this);
    if (ptr != nullptr) {
      ABSL_DCHECK_EQ(old_depth, depth_);
      ABSL_DCHECK_EQ(old_group_depth, group_depth_);
    }
    group_depth_--;
    depth_++;
    if (ABSL_PREDICT_FALSE(!ConsumeEndGroup(tag))) return nullptr;
    return ptr;
  }